

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keywords.cpp
# Opt level: O0

SyntaxKind psy::C::recognize16(char *s,ParseOptions *opts)

{
  bool bVar1;
  LanguageExtensions *this;
  ParseOptions *opts_local;
  char *s_local;
  
  if (*s == '_') {
    this = ParseOptions::languageExtensions(opts);
    bVar1 = LanguageExtensions::isEnabled_extGNU_InternalBuiltins(this);
    if (bVar1) {
      if (s[1] == '_') {
        if ((((s[2] == 'b') && (s[3] == 'u')) &&
            ((s[4] == 'i' && (((s[5] == 'l' && (s[6] == 't')) && (s[7] == 'i')))))) &&
           (((s[8] == 'n' && (s[9] == '_')) &&
            ((s[10] == 'v' &&
             (((s[0xb] == 'a' && (s[0xc] == '_')) &&
              ((s[0xd] == 'a' && ((s[0xe] == 'r' && (s[0xf] == 'g')))))))))))) {
          return Keyword_ExtGNU___builtin_va_arg;
        }
      }
      else if ((((((s[1] == '_') && (s[2] == 'b')) && (s[3] == 'u')) &&
                ((s[4] == 'i' && (s[5] == 'l')))) && (s[6] == 't')) &&
              (((((s[7] == 'i' && (s[8] == 'n')) &&
                 ((s[9] == '_' && (((s[10] == 't' && (s[0xb] == 'g')) && (s[0xc] == 'm')))))) &&
                ((s[0xd] == 'a' && (s[0xe] == 't')))) && (s[0xf] == 'h')))) {
        return Keyword_ExtGNU___builtin_tgmath;
      }
    }
  }
  return IdentifierToken;
}

Assistant:

static inline SyntaxKind recognize16(const char* s, const ParseOptions& opts)
{
    if (s[0] == '_'
            && opts.languageExtensions().isEnabled_extGNU_InternalBuiltins()) {
        if (s[1] == '_') {
            if (s[2] == 'b') {
                if (s[3] == 'u') {
                    if (s[4] == 'i') {
                        if (s[5] == 'l') {
                            if (s[6] == 't') {
                                if (s[7] == 'i') {
                                    if (s[8] == 'n') {
                                        if (s[9] == '_') {
                                            if (s[10] == 'v') {
                                                if (s[11] == 'a') {
                                                    if (s[12] == '_') {
                                                        if (s[13] == 'a') {
                                                            if (s[14] == 'r') {
                                                                if (s[15] == 'g') {
                                                                    return SyntaxKind::Keyword_ExtGNU___builtin_va_arg;
                                                                }
                                                            }
                                                        }
                                                    }
                                                }
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
        else if (s[1] == '_') {
            if (s[2] == 'b') {
                if (s[3] == 'u') {
                    if (s[4] == 'i') {
                        if (s[5] == 'l') {
                            if (s[6] == 't') {
                                if (s[7] == 'i') {
                                    if (s[8] == 'n') {
                                        if (s[9] == '_') {
                                            if (s[10] == 't') {
                                                if (s[11] == 'g') {
                                                    if (s[12] == 'm') {
                                                        if (s[13] == 'a') {
                                                            if (s[14] == 't') {
                                                                if (s[15] == 'h') {
                                                                    return SyntaxKind::Keyword_ExtGNU___builtin_tgmath;
                                                                }
                                                            }
                                                        }
                                                    }
                                                }
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }
    return SyntaxKind::IdentifierToken;
}